

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void req0_ctx_fini(void *arg)

{
  nni_mtx *mtx;
  long lVar1;
  nni_aio *pnVar2;
  
  lVar1 = *arg;
  mtx = (nni_mtx *)(lVar1 + 0x358);
  nni_mtx_lock(mtx);
  pnVar2 = *(nni_aio **)((long)arg + 0x50);
  if (pnVar2 != (nni_aio *)0x0) {
    *(undefined8 *)((long)arg + 0x50) = 0;
    nni_aio_finish_error(pnVar2,NNG_ECLOSED);
  }
  pnVar2 = *(nni_aio **)((long)arg + 0x58);
  if (pnVar2 != (nni_aio *)0x0) {
    *(undefined8 *)((long)arg + 0x58) = 0;
    nni_aio_set_msg(pnVar2,*(nni_msg **)((long)arg + 0x60));
    *(undefined8 *)((long)arg + 0x60) = 0;
    nni_aio_finish_error(pnVar2,NNG_ECLOSED);
  }
  req0_ctx_reset((req0_ctx *)arg);
  nni_list_remove((nni_list *)(lVar1 + 0xe8),arg);
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
req0_ctx_fini(void *arg)
{
	req0_ctx  *ctx = arg;
	req0_sock *s   = ctx->sock;
	nni_aio   *aio;

	nni_mtx_lock(&s->mtx);
	if ((aio = ctx->recv_aio) != NULL) {
		ctx->recv_aio = NULL;
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	if ((aio = ctx->send_aio) != NULL) {
		ctx->send_aio = NULL;
		nni_aio_set_msg(aio, ctx->req_msg);
		ctx->req_msg = NULL;
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	req0_ctx_reset(ctx);
	nni_list_remove(&s->contexts, ctx);
	nni_mtx_unlock(&s->mtx);
}